

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Def.cpp
# Opt level: O1

void __thiscall hdc::Def::~Def(Def *this)

{
  Parameter *this_00;
  Variable *this_01;
  SymbolTable *this_02;
  pointer pcVar1;
  pointer ppPVar2;
  pointer ppLVar3;
  ulong uVar4;
  
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_00196e60;
  ppPVar2 = (this->parameters).
            super__Vector_base<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->parameters).super__Vector_base<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppPVar2) {
    uVar4 = 0;
    do {
      this_00 = ppPVar2[uVar4];
      if (this_00 != (Parameter *)0x0) {
        Parameter::~Parameter(this_00);
        operator_delete(this_00);
      }
      uVar4 = uVar4 + 1;
      ppPVar2 = (this->parameters).
                super__Vector_base<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->parameters).
                                   super__Vector_base<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar2 >> 3))
    ;
  }
  ppLVar3 = (this->localVariables).
            super__Vector_base<hdc::LocalVariable_*,_std::allocator<hdc::LocalVariable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->localVariables).
      super__Vector_base<hdc::LocalVariable_*,_std::allocator<hdc::LocalVariable_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppLVar3) {
    uVar4 = 0;
    do {
      this_01 = &ppLVar3[uVar4]->super_Variable;
      if (this_01 != (Variable *)0x0) {
        Variable::~Variable(this_01);
        operator_delete(this_01);
      }
      uVar4 = uVar4 + 1;
      ppLVar3 = (this->localVariables).
                super__Vector_base<hdc::LocalVariable_*,_std::allocator<hdc::LocalVariable_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->localVariables).
                                   super__Vector_base<hdc::LocalVariable_*,_std::allocator<hdc::LocalVariable_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar3 >> 3))
    ;
  }
  if (this->return_type != (Type *)0x0) {
    (*(this->return_type->super_ASTNode)._vptr_ASTNode[2])();
  }
  if (this->statements != (CompoundStatement *)0x0) {
    (*(this->statements->super_Statement).super_ASTNode._vptr_ASTNode[2])();
  }
  this_02 = this->symbolTable;
  if (this_02 != (SymbolTable *)0x0) {
    SymbolTable::~SymbolTable(this_02);
    operator_delete(this_02);
  }
  ppLVar3 = (this->localVariables).
            super__Vector_base<hdc::LocalVariable_*,_std::allocator<hdc::LocalVariable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppLVar3 != (pointer)0x0) {
    operator_delete(ppLVar3);
  }
  ppPVar2 = (this->parameters).
            super__Vector_base<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppPVar2 != (pointer)0x0) {
    operator_delete(ppPVar2);
  }
  pcVar1 = (this->name).lexem._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).lexem.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Def::~Def() {
    for (int i = 0; i < parameters.size(); ++i) {
        delete parameters[i];
    }

    for (int i = 0; i < localVariables.size(); ++i) {
        delete localVariables[i];
    }

    delete return_type;
    delete statements;
    delete symbolTable;
}